

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::test_case_end
          (ConsoleReporter *this,CurrentTestCaseStats *st)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  ostream *poVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  
  if (this->tc->m_no_output != false) {
    return;
  }
  if ((this->opt->duration != false) || (1 < (uint)st->failure_flags)) {
    logTestStart(this);
  }
  if (this->opt->duration == true) {
    poVar4 = this->s;
    Color::operator<<(poVar4,None);
    pp_Var2 = poVar4->_vptr_basic_ostream;
    *(undefined8 *)(&poVar4->field_0x8 + (long)pp_Var2[-3]) = 6;
    p_Var3 = pp_Var2[-3];
    *(uint *)(&poVar4->field_0x18 + (long)p_Var3) =
         *(uint *)(&poVar4->field_0x18 + (long)p_Var3) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>(st->seconds);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," s: ",4);
    pcVar7 = this->tc->m_name;
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)poVar4->_vptr_basic_ostream[-3]);
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  if ((st->failure_flags & 0x10) != 0) {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Test case exceeded time limit of ",0x21);
    pp_Var2 = poVar4->_vptr_basic_ostream;
    *(undefined8 *)(&poVar4->field_0x8 + (long)pp_Var2[-3]) = 6;
    p_Var3 = pp_Var2[-3];
    *(uint *)(&poVar4->field_0x18 + (long)p_Var3) =
         *(uint *)(&poVar4->field_0x18 + (long)p_Var3) & 0xfffffefb | 4;
    poVar4 = std::ostream::_M_insert<double>(this->tc->m_timeout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!\n",2);
  }
  uVar1 = st->failure_flags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 0x40) == 0) {
      if ((uVar1 >> 9 & 1) == 0) {
        if ((char)uVar1 < '\0') {
          poVar4 = this->s;
          Color::operator<<(poVar4,Red);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Didn\'t fail exactly ",0x14);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->tc->m_expected_failures);
          pcVar7 = " times so marking it as failed!\n";
          lVar6 = 0x20;
        }
        else {
          if ((uVar1 >> 8 & 1) == 0) goto LAB_00113423;
          poVar4 = this->s;
          Color::operator<<(poVar4,Yellow);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Failed exactly ",0xf);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->tc->m_expected_failures);
          pcVar7 = " times as expected so marking it as not failed!\n";
          lVar6 = 0x30;
        }
      }
      else {
        poVar4 = this->s;
        Color::operator<<(poVar4,Yellow);
        pcVar7 = "Allowed to fail so marking it as not failed\n";
        lVar6 = 0x2c;
      }
    }
    else {
      poVar4 = this->s;
      Color::operator<<(poVar4,Yellow);
      pcVar7 = "Failed as expected so marking it as not failed\n";
      lVar6 = 0x2f;
    }
  }
  else {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    pcVar7 = "Should have failed but didn\'t! Marking it as failed!\n";
    lVar6 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar6);
LAB_00113423:
  if ((st->failure_flags & 8) != 0) {
    poVar4 = this->s;
    Color::operator<<(poVar4,Red);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Aborting - too many failed asserts!\n",0x24);
  }
  Color::operator<<(this->s,None);
  return;
}

Assistant:

void test_case_end(const CurrentTestCaseStats& st) override {
            if(tc->m_no_output)
                return;

            // log the preamble of the test case only if there is something
            // else to print - something other than that an assert has failed
            if(opt.duration ||
               (st.failure_flags && st.failure_flags != static_cast<int>(TestCaseFailureReason::AssertFailure)))
                logTestStart();

            if(opt.duration)
                s << Color::None << std::setprecision(6) << std::fixed << st.seconds
                  << " s: " << tc->m_name << "\n";

            if(st.failure_flags & TestCaseFailureReason::Timeout)
                s << Color::Red << "Test case exceeded time limit of " << std::setprecision(6)
                  << std::fixed << tc->m_timeout << "!\n";

            if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedButDidnt) {
                s << Color::Red << "Should have failed but didn't! Marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::ShouldHaveFailedAndDid) {
                s << Color::Yellow << "Failed as expected so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::CouldHaveFailedAndDid) {
                s << Color::Yellow << "Allowed to fail so marking it as not failed\n";
            } else if(st.failure_flags & TestCaseFailureReason::DidntFailExactlyNumTimes) {
                s << Color::Red << "Didn't fail exactly " << tc->m_expected_failures
                  << " times so marking it as failed!\n";
            } else if(st.failure_flags & TestCaseFailureReason::FailedExactlyNumTimes) {
                s << Color::Yellow << "Failed exactly " << tc->m_expected_failures
                  << " times as expected so marking it as not failed!\n";
            }
            if(st.failure_flags & TestCaseFailureReason::TooManyFailedAsserts) {
                s << Color::Red << "Aborting - too many failed asserts!\n";
            }
            s << Color::None; // lgtm [cpp/useless-expression]
        }